

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O1

void __thiscall
deqp::egl::Image::TextureCubeMapImageSource::initTexture
          (TextureCubeMapImageSource *this,Functions *gl)

{
  GLenum err;
  long lVar1;
  
  lVar1 = 0;
  do {
    (*gl->texImage2D)(*(GLenum *)((long)initTexture::faces + lVar1),0,
                      (this->super_TextureImageSource).m_internalFormat,0x40,0x40,0,
                      (this->super_TextureImageSource).m_format,
                      (this->super_TextureImageSource).m_type,(void *)0x0);
    err = (*gl->getError)();
    glu::checkError(err,
                    "texImage2D(faces[faceNdx], 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT, 0, m_format, m_type, DE_NULL)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x13c);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x18);
  return;
}

Assistant:

void TextureCubeMapImageSource::initTexture (const glw::Functions& gl) const
{
	// Specify mipmap level 0 for all faces
	static const GLenum faces[] =
	{
		GL_TEXTURE_CUBE_MAP_POSITIVE_X,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
		GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
		GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
		GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
	};

	for (int faceNdx = 0; faceNdx < DE_LENGTH_OF_ARRAY(faces); faceNdx++)
		GLU_CHECK_GLW_CALL(gl, texImage2D(faces[faceNdx], 0, m_internalFormat, IMAGE_WIDTH, IMAGE_HEIGHT, 0, m_format, m_type, DE_NULL));
}